

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O3

QString * __thiscall
QProcessEnvironmentPrivate::nameToString
          (QString *__return_storage_ptr__,QProcessEnvironmentPrivate *this,Key *name)

{
  QMutex *this_00;
  __pointer_type copy;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  bool bVar1;
  QByteArrayView ba;
  TryEmplaceResult local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)(name->d).ptr;
  QString::fromLocal8Bit(__return_storage_ptr__,(QString *)(name->d).size,ba);
  this_00 = &this->nameMapMutex;
  if ((this->nameMapMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_0041e56a;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_0041e56a:
  QHash<QString,QByteArray>::tryEmplace_impl<QString_const&>
            (&local_40,(QHash<QString,QByteArray> *)&this->nameMap,__return_storage_ptr__);
  QByteArray::operator=
            ((QByteArray *)
             ((((local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].entries)->storage).
              data + (ulong)((uint)(local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].
                                   offsets[(uint)local_40.iterator.i.bucket & 0x7f] * 0x30) + 0x18),
             name);
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline QString nameToString(const Key &name) const
    {
        const QString sname = QString::fromLocal8Bit(name);
        {
            const NameMapMutexLocker locker(this);
            nameMap[sname] = name;
        }
        return sname;
    }